

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O2

void __thiscall Lock::~Lock(Lock *this)

{
  TArray<OneKey,_OneKey> *this_00;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (this->keylist).Count; uVar1 = uVar1 + 1) {
    this_00 = &(this->keylist).Array[uVar1]->anykeylist;
    if (this_00 != (TArray<OneKey,_OneKey> *)0x0) {
      TArray<OneKey,_OneKey>::~TArray(this_00);
    }
    operator_delete(this_00,0x10);
  }
  TArray<Keygroup_*,_Keygroup_*>::Clear(&this->keylist);
  FString::~FString(&this->RemoteMsg);
  FString::~FString(&this->Message);
  TArray<FSoundID,_FSoundID>::~TArray(&this->locksound);
  TArray<Keygroup_*,_Keygroup_*>::~TArray(&this->keylist);
  return;
}

Assistant:

~Lock()
	{
		for(unsigned int i=0;i<keylist.Size();i++) delete keylist[i];
		keylist.Clear();
	}